

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::SVGString::parse(SVGString *this,string_view input)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  
  pbVar4 = (byte *)input._M_str;
  sVar5 = input._M_len;
  pbVar3 = pbVar4;
  if (sVar5 != 0) {
    pbVar3 = pbVar4 + sVar5;
    lVar1 = -sVar5;
    pbVar2 = pbVar4;
    do {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) {
        lVar6 = 0;
        goto LAB_0011f0ea;
      }
      pbVar2 = pbVar2 + 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  goto LAB_0011f10f;
  while (bVar7 = lVar1 + 1 != lVar6, lVar6 = lVar6 + -1, bVar7) {
LAB_0011f0ea:
    pbVar3 = pbVar2;
    if ((0x20 < (ulong)pbVar4[lVar6 + (sVar5 - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar4[lVar6 + (sVar5 - 1)] & 0x3f) & 1) == 0)) break;
  }
LAB_0011f10f:
  std::__cxx11::string::_M_replace
            ((ulong)&this->m_value,0,(char *)(this->m_value)._M_string_length,(ulong)pbVar3);
  return true;
}

Assistant:

bool SVGString::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    m_value.assign(input);
    return true;
}